

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddNotDefinedError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *undefined_symbol)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->possible_undeclared_dependency_ == (FileDescriptor *)0x0) {
    std::operator+(&local_c8,"\"",undefined_symbol);
    std::operator+(&bStack_e8,&local_c8,"\" is not defined.");
    AddError(this,element_name,descriptor,location,&bStack_e8);
    std::__cxx11::string::~string((string *)&bStack_e8);
    this_00 = &local_c8;
  }
  else {
    std::operator+(&local_48,"\"",&this->possible_undeclared_dependency_name_);
    std::operator+(&local_a8,&local_48,"\" seems to be defined in \"");
    std::operator+(&local_88,&local_a8,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    this->possible_undeclared_dependency_);
    std::operator+(&local_68,&local_88,"\", which is not imported by \"");
    std::operator+(&local_c8,&local_68,&this->filename_);
    std::operator+(&bStack_e8,&local_c8,"\".  To use it here, please add the necessary import.");
    AddError(this,element_name,descriptor,location,&bStack_e8);
    std::__cxx11::string::~string((string *)&bStack_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void DescriptorBuilder::AddNotDefinedError(
    const string& element_name,
    const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const string& undefined_symbol) {
  if (possible_undeclared_dependency_ == NULL) {
    AddError(element_name, descriptor, location,
             "\"" + undefined_symbol + "\" is not defined.");
  } else {
    AddError(element_name, descriptor, location,
             "\"" + possible_undeclared_dependency_name_ +
             "\" seems to be defined in \"" +
             possible_undeclared_dependency_->name() + "\", which is not "
             "imported by \"" + filename_ + "\".  To use it here, please "
             "add the necessary import.");
  }
}